

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O1

tree_node * __thiscall RegexTree::build_block(RegexTree *this,char *str,int num)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  tree_node *ptVar4;
  tree_node *ptVar5;
  long lVar6;
  tree_node *ptVar7;
  tree_node *ptVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  
  cVar3 = *str;
  if (cVar3 == '(') {
    cVar3 = str[1];
    iVar11 = -1;
    if (cVar3 != '\0') {
      iVar9 = 1;
      lVar6 = 2;
      do {
        iVar9 = (iVar9 + (uint)(cVar3 == '(')) - (uint)(cVar3 == ')');
        if (iVar9 == 0) {
          iVar11 = (int)lVar6 + -1;
          break;
        }
        cVar3 = str[lVar6];
        lVar6 = lVar6 + 1;
      } while (cVar3 != '\0');
    }
    ptVar4 = build_block(this,str + 1,iVar11 + -1);
    iVar11 = iVar11 + 1;
  }
  else if (cVar3 == '\\') {
    ptVar4 = (tree_node *)operator_new(0x18);
    ptVar4->left = (tree_node *)0x0;
    ptVar4->right = (tree_node *)0x0;
    ptVar4->c = '\x11';
    ptVar5 = (tree_node *)operator_new(0x18);
    ptVar5->left = (tree_node *)0x0;
    ptVar5->right = (tree_node *)0x0;
    ptVar5->c = '\0';
    ptVar4->left = ptVar5;
    cVar3 = str[1];
    if (cVar3 == 'n') {
      cVar3 = '\n';
    }
    else if (cVar3 == 'r') {
      cVar3 = '\r';
    }
    else if (cVar3 == 't') {
      cVar3 = '\t';
    }
    ptVar5->c = cVar3;
    iVar11 = 2;
  }
  else {
    ptVar4 = (tree_node *)operator_new(0x18);
    ptVar4->left = (tree_node *)0x0;
    ptVar4->right = (tree_node *)0x0;
    ptVar4->c = '\x11';
    ptVar5 = (tree_node *)operator_new(0x18);
    ptVar5->left = (tree_node *)0x0;
    ptVar5->right = (tree_node *)0x0;
    ptVar5->c = '\0';
    ptVar4->left = ptVar5;
    ptVar5->c = cVar3;
    iVar11 = 1;
  }
  if (iVar11 < num) {
    bVar1 = false;
    do {
      cVar3 = str[iVar11];
      if ((cVar3 == '\\') && (bVar2 = true, !bVar1)) goto LAB_001034e4;
      if (bVar1) {
        if (cVar3 == 'n') {
          cVar3 = '\n';
        }
        else if (cVar3 == 'r') {
          cVar3 = '\r';
        }
        else if (cVar3 == 't') {
          cVar3 = '\t';
        }
      }
      else {
        cVar3 = parse_control(cVar3);
      }
      switch(cVar3) {
      case '\t':
        if ((ptVar4 == (tree_node *)0x0) || (ptVar4->c != '\x11')) {
          ptVar5 = ptVar4->right;
          if ((ptVar5 == (tree_node *)0x0) || (ptVar5->c != '\x11')) {
            ptVar8 = (tree_node *)operator_new(0x18);
            ptVar8->left = (tree_node *)0x0;
            ptVar8->right = (tree_node *)0x0;
            ptVar8->c = '\t';
            ptVar8->left = ptVar5;
            ptVar4->right = ptVar8;
          }
          else {
            ptVar5->c = '\t';
          }
        }
        else {
          ptVar4->c = '\t';
        }
        goto LAB_00103391;
      case '\n':
        cVar3 = str[(long)iVar11 + 1];
        if (cVar3 == '(') {
          cVar3 = str[(long)iVar11 + 2];
          iVar9 = -1;
          if (cVar3 != '\0') {
            iVar10 = 1;
            lVar6 = 3;
            do {
              iVar10 = (iVar10 + (uint)(cVar3 == '(')) - (uint)(cVar3 == ')');
              if (iVar10 == 0) {
                iVar9 = (int)lVar6 + -2;
                break;
              }
              cVar3 = str[lVar6 + iVar11];
              lVar6 = lVar6 + 1;
            } while (cVar3 != '\0');
          }
          ptVar5 = build_block(this,str + (long)iVar11 + 2,iVar9 + -1);
          iVar11 = iVar11 + iVar9 + 1;
        }
        else {
          if (cVar3 == '\\') {
            ptVar5 = (tree_node *)operator_new(0x18);
            ptVar5->left = (tree_node *)0x0;
            ptVar5->right = (tree_node *)0x0;
            ptVar5->c = '\0';
            cVar3 = str[(long)iVar11 + 2];
            if (cVar3 == 'n') {
              cVar3 = '\n';
            }
            else if (cVar3 == 'r') {
              cVar3 = '\r';
            }
            else if (cVar3 == 't') {
              cVar3 = '\t';
            }
            iVar9 = 2;
            ptVar5->c = cVar3;
          }
          else {
            iVar9 = 1;
            ptVar5 = (tree_node *)operator_new(0x18);
            ptVar5->left = (tree_node *)0x0;
            ptVar5->right = (tree_node *)0x0;
            ptVar5->c = cVar3;
          }
          iVar11 = iVar11 + iVar9;
        }
        if ((ptVar4 == (tree_node *)0x0) || (ptVar4->c != '\x11')) {
          ptVar8 = ptVar4->right;
          if ((ptVar8 == (tree_node *)0x0) || (ptVar8->c != '\x11')) {
            ptVar7 = (tree_node *)operator_new(0x18);
            ptVar7->left = (tree_node *)0x0;
            ptVar7->right = (tree_node *)0x0;
            ptVar7->c = '\n';
            ptVar7->left = ptVar8;
            ptVar4->right = ptVar7;
            ptVar7->right = ptVar5;
          }
          else {
LAB_001034b2:
            ptVar8->c = '\n';
            ptVar8->right = ptVar5;
          }
        }
        else {
LAB_00103494:
          ptVar4->c = '\n';
LAB_0010349a:
          ptVar4->right = ptVar5;
        }
        break;
      case '\v':
        if ((ptVar4 != (tree_node *)0x0) && (ptVar4->c == '\x11')) {
          ptVar4->c = '\b';
          ptVar5 = (tree_node *)operator_new(0x18);
          ptVar5->left = (tree_node *)0x0;
          ptVar5->right = (tree_node *)0x0;
          ptVar5->c = '\t';
          ptVar8 = copy_tree(this,ptVar4->left);
          ptVar5->left = ptVar8;
          goto LAB_0010349a;
        }
        ptVar5 = ptVar4->right;
        if ((ptVar5 == (tree_node *)0x0) || (ptVar5->c != '\x11')) {
          ptVar8 = (tree_node *)operator_new(0x18);
          ptVar8->left = (tree_node *)0x0;
          ptVar8->right = (tree_node *)0x0;
          ptVar8->c = '\b';
          ptVar7 = (tree_node *)operator_new(0x18);
          ptVar7->left = (tree_node *)0x0;
          ptVar7->right = (tree_node *)0x0;
          ptVar7->c = '\t';
          ptVar8->right = ptVar7;
          ptVar8->left = ptVar5;
          ptVar5 = copy_tree(this,ptVar5);
          ptVar7->left = ptVar5;
          ptVar4->right = ptVar8;
        }
        else {
          ptVar5->c = '\b';
          ptVar8 = (tree_node *)operator_new(0x18);
          ptVar8->left = (tree_node *)0x0;
          ptVar8->right = (tree_node *)0x0;
          ptVar8->c = '\t';
          ptVar7 = copy_tree(this,ptVar5->left);
          ptVar8->left = ptVar7;
          ptVar5->right = ptVar8;
        }
        break;
      case '\f':
        ptVar5 = (tree_node *)operator_new(0x18);
        ptVar5->left = (tree_node *)0x0;
        ptVar5->right = (tree_node *)0x0;
        ptVar5->c = '\a';
        if ((ptVar4 != (tree_node *)0x0) && (ptVar4->c == '\x11')) goto LAB_00103494;
        ptVar8 = ptVar4->right;
        if ((ptVar8 != (tree_node *)0x0) && (ptVar8->c == '\x11')) goto LAB_001034b2;
        ptVar7 = (tree_node *)operator_new(0x18);
        ptVar7->left = (tree_node *)0x0;
        ptVar7->right = (tree_node *)0x0;
        ptVar7->c = '\n';
        ptVar7->left = ptVar8;
        ptVar7->right = ptVar5;
        ptVar4->right = ptVar7;
        break;
      default:
        if (ptVar4->c == '\x11') {
          ptVar4->c = '\b';
          ptVar5 = ptVar4;
        }
        else {
          ptVar5 = (tree_node *)operator_new(0x18);
          ptVar5->left = (tree_node *)0x0;
          ptVar5->right = (tree_node *)0x0;
          ptVar5->c = '\b';
          ptVar5->left = ptVar4;
        }
        ptVar4 = (tree_node *)operator_new(0x18);
        ptVar4->left = (tree_node *)0x0;
        ptVar4->right = (tree_node *)0x0;
        ptVar4->c = '\0';
        ptVar5->right = ptVar4;
        ptVar4->c = cVar3;
        ptVar4 = ptVar5;
LAB_00103391:
        bVar2 = false;
        goto LAB_001034e4;
      case '\x11':
        cVar3 = str[(long)iVar11 + 1];
        iVar9 = -1;
        if (cVar3 != '\0') {
          iVar10 = 1;
          lVar6 = 2;
          do {
            iVar10 = (iVar10 + (uint)(cVar3 == '(')) - (uint)(cVar3 == ')');
            if (iVar10 == 0) {
              iVar9 = (int)lVar6 + -1;
              break;
            }
            cVar3 = str[lVar6 + iVar11];
            lVar6 = lVar6 + 1;
          } while (cVar3 != '\0');
        }
        ptVar5 = build_block(this,str + (long)iVar11 + 1,iVar9 + -1);
        if ((ptVar4 == (tree_node *)0x0) || (ptVar4->c != '\x11')) {
          ptVar8 = (tree_node *)operator_new(0x18);
          ptVar8->left = (tree_node *)0x0;
          ptVar8->right = (tree_node *)0x0;
          ptVar8->c = '\b';
          ptVar8->left = ptVar4;
        }
        else {
          ptVar4->c = '\b';
          ptVar8 = ptVar4;
        }
        ptVar8->right = ptVar5;
        iVar11 = iVar9 + iVar11;
        ptVar4 = ptVar8;
      }
      bVar2 = false;
LAB_001034e4:
      bVar1 = bVar2;
      iVar11 = iVar11 + 1;
    } while (iVar11 < num);
  }
  ptVar5 = (tree_node *)operator_new(0x18);
  ptVar5->left = (tree_node *)0x0;
  ptVar5->right = (tree_node *)0x0;
  ptVar5->c = '\x11';
  ptVar5->left = ptVar4;
  return ptVar5;
}

Assistant:

tree_node *RegexTree::build_block(const char *str, int num) {
    tree_node *curr;
    int i = 0;
    bool escape = false;

    if (str[i] != '\\' && str[i] != '(') {
        curr = new tree_node;
        curr->c = BLOCK;

        curr->left = new tree_node;
        curr->left->c = str[i];
        i++;
    } else if (str[i] == '\\') {
        curr = new tree_node;
        curr->c = BLOCK;

        curr->left = new tree_node;
        curr->left->c = parse_escape(str[i + 1]);
        i += 2;
    } else {
        int blen = block_len(str + 1);
        curr = build_block(str + 1, blen - 1);
        i += blen + 1;
    }


    for (; i < num; i++) {
        char ch = str[i];
        if (str[i] == '\\' && !escape) {
            escape = true;
            continue;
        }

        if (!escape) {
            ch = parse_control(ch);
        } else {
            ch = parse_escape(ch);
        }

        escape = false;
        switch (ch) {
            case STAR: {
                if (isBlock(curr))
                    curr->c = STAR;
                else {
                    tree_node *tmp = curr->right;
                    if (isBlock(tmp))
                        tmp->c = STAR;
                    else {
                        tree_node *star = new tree_node;
                        star->c = STAR;
                        star->left = tmp;
                        curr->right = star;
                    }
                }
                break;
            }
            case QUESTION: {
                tree_node *epsilon = new tree_node;
                epsilon->c = EPSILON;
                if (isBlock(curr)) {
                    curr->c = OR;
                    curr->right = epsilon;
                } else {
                    tree_node *tmp = curr->right;
                    if (isBlock(tmp)) {
                        tmp->c = OR;
                        tmp->right = epsilon;
                    } else {
                        tree_node *_or = new tree_node;
                        _or->c = OR;
                        _or->left = tmp;
                        _or->right = epsilon;
                        curr->right = _or;
                    }
                }
                break;
            }
            case PLUS: {
                if (isBlock(curr)) {
                    curr->c = CAT;

                    tree_node *star = new tree_node;
                    star->c = STAR;
                    star->left = copy_tree(curr->left);
                    curr->right = star;
                } else {
                    tree_node *tmp = curr->right;
                    if (isBlock(tmp)) {
                        tmp->c = CAT;

                        tree_node *star = new tree_node;
                        star->c = STAR;
                        star->left = copy_tree(tmp->left);
                        tmp->right = star;
                    } else {
                        tree_node *cat = new tree_node;
                        cat->c = CAT;

                        tree_node *star = new tree_node;
                        star->c = STAR;

                        cat->right = star;
                        cat->left = tmp;

                        star->left = copy_tree(tmp);
                        curr->right = cat;
                    }
                }
                break;
            }
            case OR: {
                tree_node *right_side;
                if (str[i + 1] != '\\' && str[i + 1] != '(') { // normal char
                    right_side = new tree_node;
                    right_side->c = str[i + 1];
                    i++;
                } else if (str[i + 1] == '\\') { // escape char
                    right_side = new tree_node;
                    right_side->c = parse_escape(str[i + 2]);
                    i += 2;
                } else { // a block
                    int blen = block_len(str + i + 2);
                    right_side = build_block(str + i + 2, blen - 1);
                    i += blen + 1;
                }

                if (isBlock(curr)) {
                    curr->c = OR;
                    curr->right = right_side;
                } else {
                    tree_node *tmp = curr->right;
                    if (isBlock(tmp)) {
                        tmp->c = OR;
                        tmp->right = right_side;
                    } else {
                        tree_node *_or = new tree_node;
                        _or->c = OR;
                        _or->left = tmp;

                        curr->right = _or;
                        _or->right = right_side;
                    }
                }
                break;
            }
            case BLOCK: {
                tree_node *right_side;
                int blen = block_len(str + i + 1);
                right_side = build_block(str + i + 1, blen - 1);
                if (isBlock(curr)) {
                    curr->c = CAT;
                    curr->right = right_side;
                } else {
                    tree_node *cat = new tree_node;
                    cat->c = CAT;
                    cat->left = curr;
                    curr = cat;
                    curr->right = right_side;
                }
                i += blen;
                break;
            }

            case WILDCARD:
            default: {
                if (curr->c == BLOCK)
                    curr->c = CAT;
                else {
                    tree_node *cat = new tree_node;
                    cat->c = CAT;
                    cat->left = curr;
                    curr = cat;
                }
                curr->right = new tree_node;
                curr->right->c = ch;
                break;
            }
        }
    }

    tree_node *block = new tree_node;
    block->c = BLOCK;
    block->left = curr;
    return block;
}